

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O0

void __thiscall
moodycamel::ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::Block::
reset_empty<(moodycamel::ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::InnerQueueContext)0>
          (Block *this)

{
  long in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  *(undefined8 *)(in_RDI + 0x508) = 0;
  return;
}

Assistant:

inline void reset_empty()
        {
            if (context == explicit_context && BLOCK_SIZE <= EXPLICIT_BLOCK_EMPTY_COUNTER_THRESHOLD) {
                // Reset flags
                for (size_t i = 0; i != BLOCK_SIZE; ++i) {
                    emptyFlags[i].store(false, std::memory_order_relaxed);
                }
            }
            else {
                // Reset counter
                elementsCompletelyDequeued.store(0, std::memory_order_relaxed);
            }
        }